

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_reference.c
# Opt level: O0

bool_t prf_external_reference_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  int8_t iVar1;
  uint16_t uVar2;
  int16_t iVar3;
  int32_t iVar4;
  void *pvVar5;
  bfile_t *in_RDX;
  long *in_RSI;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict *data;
  int pos;
  bfile_t *in_stack_ffffffffffffffc8;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  uint in_stack_ffffffffffffffdc;
  int iVar6;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar7;
  
  uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
  *in_RDI = uVar2;
  if (*in_RDI == prf_external_reference_info.opcode) {
    uVar2 = bf_get_uint16_be(in_stack_ffffffffffffffd0);
    in_RDI[1] = uVar2;
    if (in_RDI[1] < 0xd4) {
      prf_error(9,"external reference node too short (%d bytes)",(ulong)in_RDI[1]);
      bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
      bVar7 = 0;
    }
    else {
      if ((4 < in_RDI[1]) && (*(long *)(in_RDI + 4) == 0)) {
        if (*(short *)(*in_RSI + 8) == 0) {
          pvVar5 = malloc((long)(int)(in_RDI[1] - 4) + 4);
          *(void **)(in_RDI + 4) = pvVar5;
        }
        else {
          pvVar5 = pool_malloc((pool_t)((ulong)in_RSI >> 0x30),(int)in_RSI);
          *(void **)(in_RDI + 4) = pvVar5;
        }
        if (*(long *)(in_RDI + 4) == 0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
          return 0;
        }
      }
      iVar6 = 4;
      bfile_00 = *(bfile_t **)(in_RDI + 4);
      bf_read(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(uint)((ulong)in_RDI >> 0x20));
      iVar6 = iVar6 + 200;
      iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
      *(int8_t *)&bfile_00[2].filename = iVar1;
      iVar6 = iVar6 + 1;
      iVar1 = bf_get_int8(in_stack_ffffffffffffffc8);
      *(int8_t *)((long)&bfile_00[2].filename + 1) = iVar1;
      iVar6 = iVar6 + 1;
      iVar3 = bf_get_int16_be(bfile_00);
      *(int16_t *)((long)&bfile_00[2].filename + 2) = iVar3;
      iVar6 = iVar6 + 2;
      iVar3 = bf_get_int16_be(bfile_00);
      *(int16_t *)((long)&bfile_00[2].filename + 4) = iVar3;
      iVar6 = iVar6 + 2;
      iVar4 = bf_get_int32_be(bfile_00);
      *(int32_t *)&bfile_00[2].buffer = iVar4;
      if (iVar6 + 4 < (int)(uint)in_RDI[1]) {
        bf_read(unaff_retaddr,
                (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                (uint)((ulong)in_RDI >> 0x20));
      }
      bVar7 = 1;
    }
  }
  else {
    prf_error(9,"tried external reference node load method on node of type %d.",(ulong)*in_RDI);
    bf_rewind(in_RDX,in_stack_ffffffffffffffdc);
    bVar7 = 0;
  }
  return bVar7;
}

Assistant:

static
bool_t
prf_external_reference_load_f(prf_node_t * node,
                              prf_state_t * state,
                              bfile_t * bfile)
{
  int pos;

  assert(node != NULL && state != NULL && bfile != NULL);
  
  node->opcode = bf_get_uint16_be(bfile);
  if (node->opcode != prf_external_reference_info.opcode) {
    prf_error(9,
              "tried external reference node load method on node of type %d.",
              node->opcode);
    bf_rewind(bfile, 2);
    return FALSE;
  }

  node->length = bf_get_uint16_be(bfile);
  if (node->length < NODE_DATA_SIZE + 4) {
    prf_error(9, "external reference node too short (%d bytes)", node->length);
    bf_rewind(bfile, 4);
    return FALSE;
  }

  if (node->length > 4 && node->data == NULL) {
    assert(state->model != NULL);
    if (state->model->mempool_id == 0) {
      node->data = (uint8_t *)malloc(node->length - 4 + NODE_DATA_PAD);
    }
    else {
      node->data = (uint8_t *)pool_malloc(state->model->mempool_id,
                                          node->length - 4 + NODE_DATA_PAD);
    }
    if (node->data == NULL) {
      prf_error(9, "memory allocation problem (returned NULL)");
      bf_rewind(bfile, 4);
      return FALSE;
    }
  }

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;
    bf_read(bfile, data->filename, 200); pos += 200;
    data->reserved1 = bf_get_int8(bfile); pos += 1;
    data->reserved2 = bf_get_int8(bfile); pos += 1;
    data->reserved3[0] = bf_get_int16_be(bfile); pos += 2;
    data->reserved3[1] = bf_get_int16_be(bfile); pos += 2;
    data->flags = bf_get_int32_be(bfile); pos += 4;
  } while (FALSE);

  if (node->length > pos)
    pos += bf_read(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                   node->length - pos);

  return TRUE;
}